

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O2

void __thiscall
adios2::transport::NullTransport::Write(NullTransport *this,char *buffer,size_t size,size_t start)

{
  NullTransportImpl *pNVar1;
  ulong uVar2;
  allocator local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
      _M_head_impl)->IsOpen == false) {
    std::__cxx11::string::string((string *)&local_e0,"Toolkit",&local_e1);
    std::__cxx11::string::string((string *)&local_80,"transport::NullTransport",&local_e2);
    std::__cxx11::string::string((string *)&local_a0,"Write",&local_e3);
    std::__cxx11::string::string((string *)&local_c0,"transport is not open yet",&local_e4);
    helper::Throw<std::runtime_error>(&local_e0,&local_80,&local_a0,&local_c0,-1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::string((string *)&local_40,"write",(allocator *)&local_e0);
  Transport::ProfilerStart(&this->super_Transport,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  uVar2 = start + size;
  pNVar1 = (this->Impl)._M_t.
           super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
           _M_head_impl;
  pNVar1->CurPos = uVar2;
  if (pNVar1->Capacity < uVar2) {
    pNVar1->Capacity = uVar2;
  }
  std::__cxx11::string::string((string *)&local_60,"write",(allocator *)&local_e0);
  Transport::ProfilerStop(&this->super_Transport,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void NullTransport::Write(const char *buffer, size_t size, size_t start)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "Write",
                                          "transport is not open yet");
    }

    ProfilerStart("write");
    Impl->CurPos = start + size;
    if (Impl->CurPos > Impl->Capacity)
    {
        Impl->Capacity = Impl->CurPos;
    }
    ProfilerStop("write");
}